

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalSequenceNoSideEffCase2(ShaderEvalContext *ctx)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  VecAccess<float,_4,_2> local_38;
  undefined1 local_28 [16];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *ctx_local;
  
  local_10 = ctx;
  pfVar3 = tcu::Vector<float,_4>::z(ctx->in);
  fVar1 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::x(local_10->in + 1);
  fVar2 = *pfVar3;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)local_10 + 0x50,2);
  sequenceNoSideEffCase2((Functional *)(local_28 + 8),0.0 < fVar1,0.0 < fVar2,(Vec2 *)local_28);
  tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&local_18);
  local_38 = tcu::Vector<float,_4>::yz(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_38,&local_18);
  return;
}

Assistant:

void evalSequenceNoSideEffCase2	(ShaderEvalContext& ctx) { ctx.color.yz()	= sequenceNoSideEffCase2		(ctx.in[0].z() > 0.0f,			ctx.in[1].x() > 0.0f,					ctx.in[2].swizzle(2, 1)).asFloat(); }